

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::BuildResult(Clipper *this,Paths *polys)

{
  _func_int *p_Var1;
  long lVar2;
  uint uVar3;
  OutPt *Pts;
  ulong uVar4;
  bool bVar5;
  Path pg;
  _Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_48;
  
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::reserve(polys,*(long *)(this->_vptr_Clipper[-3] +
                           (long)&(this->m_Maxima).
                                  super__List_base<long_long,_std::allocator<long_long>_>) -
                  *(long *)((long)&this->m_ClipType + (long)this->_vptr_Clipper[-3]) >> 3);
  uVar4 = 0;
  while( true ) {
    p_Var1 = this->_vptr_Clipper[-3];
    lVar2 = *(long *)((long)&this->m_ClipType + (long)p_Var1);
    if ((ulong)(*(long *)(p_Var1 + (long)&(this->m_Maxima).
                                          super__List_base<long_long,_std::allocator<long_long>_>) -
                lVar2 >> 3) <= uVar4) break;
    if (*(long *)(*(long *)(lVar2 + uVar4 * 8) + 0x18) != 0) {
      local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Pts = *(OutPt **)
             (*(long *)(*(long *)(*(long *)((long)&this->m_ClipType + (long)this->_vptr_Clipper[-3])
                                 + uVar4 * 8) + 0x18) + 0x20);
      uVar3 = PointCount(Pts);
      if (1 < (int)uVar3) {
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::reserve
                  ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)&local_48,
                   (ulong)uVar3);
        while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
          std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
                    ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                     &local_48,&Pts->Pt);
          Pts = Pts->Prev;
        }
        std::
        vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ::push_back(polys,(value_type *)&local_48);
      }
      std::_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~_Vector_base
                (&local_48);
    }
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void Clipper::BuildResult(Paths &polys)
{
  polys.reserve(m_PolyOuts.size());
  for (PolyOutList::size_type i = 0; i < m_PolyOuts.size(); ++i)
  {
    if (!m_PolyOuts[i]->Pts) continue;
    Path pg;
    OutPt* p = m_PolyOuts[i]->Pts->Prev;
    int cnt = PointCount(p);
    if (cnt < 2) continue;
    pg.reserve(cnt);
    for (int i = 0; i < cnt; ++i)
    {
      pg.push_back(p->Pt);
      p = p->Prev;
    }
    polys.push_back(pg);
  }
}